

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyPureVectorForClusteredBG.cpp
# Opt level: O0

void __thiscall
JointPolicyPureVectorForClusteredBG::RecursivelyFillPolicyForAgent
          (JointPolicyPureVectorForClusteredBG *this,PlanningUnitDecPOMDPDiscrete *pu,
          JPPV_sharedPtr *jpolJPPV,Index agI,Index ts,Index aohI,Index ohI,TypeCluster *tc,Index tI,
          Index aI,vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
                   *jpolBGVec,
          vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
          *bgVec)

{
  Index IVar1;
  uint uVar2;
  const_reference ppJVar3;
  size_t sVar4;
  PlanningUnitMADPDiscrete *pPVar5;
  uint in_ECX;
  PlanningUnitDecPOMDPDiscrete *in_RDX;
  JointPolicyPureVectorForClusteredBG *in_RSI;
  undefined8 in_RDI;
  int in_R8D;
  Index in_R9D;
  Index unaff_retaddr;
  TypeCluster *in_stack_00000008;
  Index in_stack_00000010;
  Index in_stack_00000018;
  vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
  *in_stack_00000020;
  vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
  *in_stack_00000028;
  Index n_ts;
  Index h;
  TypeCluster *n_tc;
  E *e;
  Index n_aI;
  Index n_tI;
  Index n_ohI;
  Index n_aohI;
  Index obsI;
  shared_ptr<const_BayesianGameWithClusterInfo> bg;
  JointPolicyDiscretePure *jpolBG;
  Index in_stack_fffffffffffffeb8;
  Index in_stack_fffffffffffffebc;
  PlanningUnitMADPDiscrete *in_stack_fffffffffffffec0;
  size_t in_stack_fffffffffffffef8;
  type in_stack_ffffffffffffff00;
  PlanningUnitMADPDiscrete *in_stack_ffffffffffffff08;
  uint in_stack_ffffffffffffff18;
  Index in_stack_ffffffffffffff1c;
  type in_stack_ffffffffffffff20;
  Index in_stack_ffffffffffffff28;
  Index in_stack_ffffffffffffff2c;
  TypeCluster *in_stack_ffffffffffffff50;
  Index in_stack_ffffffffffffff5c;
  uint in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  uint local_64;
  shared_ptr<const_BayesianGameWithClusterInfo> local_60;
  value_type pJVar6;
  Index in_stack_ffffffffffffffb8;
  PlanningUnitDecPOMDPDiscrete *pu_00;
  
  pu_00 = in_RDX;
  ppJVar3 = std::
            vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
            ::at((vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
                  *)in_stack_fffffffffffffec0,
                 CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  pJVar6 = *ppJVar3;
  std::
  vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
  ::at((vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
        *)in_stack_fffffffffffffec0,CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  boost::shared_ptr<const_BayesianGameWithClusterInfo>::shared_ptr
            ((shared_ptr<const_BayesianGameWithClusterInfo> *)in_stack_fffffffffffffec0,
             (shared_ptr<const_BayesianGameWithClusterInfo> *)
             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  local_64 = 0;
  while( true ) {
    IVar1 = (Index)(in_stack_fffffffffffffef8 >> 0x20);
    sVar4 = PlanningUnitMADPDiscrete::GetNrObservations
                      (in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
    if (sVar4 <= local_64) break;
    in_stack_ffffffffffffff2c =
         PlanningUnitMADPDiscrete::GetSuccessorAOHI
                   ((PlanningUnitMADPDiscrete *)
                    CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                    (Index)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                    (Index)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                    in_stack_ffffffffffffff18);
    IVar1 = PlanningUnitMADPDiscrete::GetSuccessorOHI
                      (in_stack_ffffffffffffff08,(Index)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                       (Index)in_stack_ffffffffffffff00,IVar1);
    in_stack_ffffffffffffff28 = IVar1;
    in_stack_ffffffffffffff20 =
         boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator->(&local_60);
    in_stack_ffffffffffffff1c =
         BayesianGameWithClusterInfo::FindTypeClusterIndex
                   ((BayesianGameWithClusterInfo *)
                    CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                    in_stack_ffffffffffffff5c,in_stack_ffffffffffffff50,
                    (Index)((ulong)in_RDI >> 0x20),(Index)in_RDI);
    uVar2 = (*(pJVar6->super_JointPolicyDiscrete).super_JointPolicy._vptr_JointPolicy[0x13])
                      (pJVar6,(ulong)in_ECX,(ulong)in_stack_ffffffffffffff1c);
    in_stack_ffffffffffffff18 = uVar2;
    boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator->(&local_60);
    pPVar5 = (PlanningUnitMADPDiscrete *)
             BayesianGameWithClusterInfo::GetTypeCluster
                       ((BayesianGameWithClusterInfo *)in_stack_fffffffffffffec0,
                        in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8);
    in_stack_ffffffffffffff08 = pPVar5;
    in_stack_ffffffffffffff00 =
         boost::shared_ptr<JointPolicyPureVector>::operator->
                   ((shared_ptr<JointPolicyPureVector> *)in_RDX);
    (*(in_stack_ffffffffffffff00->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.
      super_JointPolicy._vptr_JointPolicy[0x10])
              (in_stack_ffffffffffffff00,(ulong)in_ECX,(ulong)IVar1,(ulong)uVar2);
    in_stack_fffffffffffffef8 = PlanningUnit::GetHorizon((PlanningUnit *)in_RSI);
    in_stack_ffffffffffffff64 = (int)in_stack_fffffffffffffef8;
    in_stack_ffffffffffffff60 = in_R8D + 1;
    if (in_stack_ffffffffffffff60 <= in_stack_ffffffffffffff64 - 1U) {
      boost::shared_ptr<JointPolicyPureVector>::shared_ptr
                ((shared_ptr<JointPolicyPureVector> *)in_stack_fffffffffffffec0,
                 (shared_ptr<JointPolicyPureVector> *)
                 CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      RecursivelyFillPolicyForAgent
                (in_RSI,pu_00,(JPPV_sharedPtr *)CONCAT44(in_ECX,in_R8D),in_R9D,
                 in_stack_ffffffffffffffb8,(Index)((ulong)pJVar6 >> 0x20),unaff_retaddr,
                 in_stack_00000008,in_stack_00000010,in_stack_00000018,in_stack_00000020,
                 in_stack_00000028);
      boost::shared_ptr<JointPolicyPureVector>::~shared_ptr
                ((shared_ptr<JointPolicyPureVector> *)0x8c90be);
      in_stack_fffffffffffffeb8 = IVar1;
      in_stack_fffffffffffffec0 = pPVar5;
    }
    local_64 = local_64 + 1;
  }
  boost::shared_ptr<const_BayesianGameWithClusterInfo>::~shared_ptr
            ((shared_ptr<const_BayesianGameWithClusterInfo> *)0x8c910a);
  return;
}

Assistant:

void
JointPolicyPureVectorForClusteredBG::RecursivelyFillPolicyForAgent(
            const PlanningUnitDecPOMDPDiscrete* pu,
            JPPV_sharedPtr jpolJPPV,
            Index agI,
            Index ts,
            Index aohI,
            Index ohI,
            const TypeCluster* tc,
            Index tI,
            Index aI,
            const std::vector<const JointPolicyDiscretePure* >& jpolBGVec,
            const std::vector<boost::shared_ptr<const BayesianGameWithClusterInfo> >& bgVec
    )const 
{    
    //const JointPolicyPureVectorForClusteredBG* jpolBG = jpolBGVec.at(ts);
    const JointPolicyDiscretePure *  jpolBG = jpolBGVec.at(ts);
    boost::shared_ptr<const BayesianGameWithClusterInfo> bg = bgVec.at(ts);

#if DEBUG_TOJPPV
    cout << ">>>Starting RecursivelyFillPolicyForAgent for " << endl;
    cout << "agI="<<agI<<endl;
    cout << "ts="<<ts<<endl;
    cout << "aohI="<<aohI<<endl;
    cout << "ohI="<<ohI<<endl;
    cout << "tI="<<tI<<endl;
    cout << "aI="<<aI<<endl;
    cout << "BG: " << endl << bg->SoftPrint();
    cout << endl;
#endif
    Index obsI = 0;
    for(obsI=0; obsI < pu->GetNrObservations(agI); obsI++)
    {
        Index n_aohI = pu->GetSuccessorAOHI(agI, aohI, aI, obsI);
        Index n_ohI = pu->GetSuccessorOHI(agI, ohI, obsI);
        ///NOTE: this can throw an error if there is no type 
        //for the history (e.g. if the histories prob. is 0)
        Index n_tI = 0;
        Index n_aI = 0; // ensure that action 0 is selected if exception is thrown
        try{
            n_tI = bg->FindTypeClusterIndex(agI, tc, aI, obsI);
            n_aI = jpolBG->GetActionIndex(agI, n_tI);
        } catch (E& e) {
            cout << "JointPolicyPureVectorForClusteredBG::RecursivelyFillPolicyForAgent implement catch?\n";
            continue;
        }

        const TypeCluster* n_tc =  bg->GetTypeCluster(agI, n_tI);
        
        jpolJPPV->SetAction(agI, n_ohI, n_aI); //<- here something happens

        Index h = pu->GetHorizon();
        Index n_ts = ts+1;
        if(n_ts  <= h - 1) // ts + 1 <= h - 1
        {
            RecursivelyFillPolicyForAgent(
                pu, jpolJPPV, agI, n_ts, n_aohI, n_ohI, 
                n_tc, n_tI, n_aI, jpolBGVec, bgVec);
        }
        else
        {
#if DEBUG_TOJPPV
            cout << "this is last stage, no further RecursivelyFillPolicyForAgent"<<endl;
#endif
        }
    }
}